

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::MessageOptions::_InternalParse(MessageOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint64 uVar2;
  UninterpretedOption *pUVar3;
  ParseContext *in_RDX;
  UninterpretedOption *in_RSI;
  char *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  char **in_stack_ffffffffffffff88;
  ParseContext *in_stack_ffffffffffffff90;
  ParseContext *in_stack_ffffffffffffff98;
  UninterpretedOption *in_stack_ffffffffffffffa0;
  ParseContext *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint local_3c;
  ParseContext *in_stack_ffffffffffffffd0;
  char *ptr_00;
  ExtensionSet *__s;
  ExtensionSet *this_00;
  
  __s = (ExtensionSet *)&stack0xffffffffffffffd4;
  ptr_00 = in_RDI;
  this_00 = __s;
  memset(__s,0,4);
  GetArenaNoVirtual((MessageOptions *)in_stack_ffffffffffffff90);
LAB_00690e71:
  do {
    bVar1 = internal::ParseContext::Done(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0069120d;
    in_RSI = (UninterpretedOption *)
             internal::ReadTag(in_RDI,(uint32 *)
                                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               (uint32)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if (in_RSI == (UninterpretedOption *)0x0) goto LAB_0069122a;
    in_stack_ffffffffffffffb4 = local_3c >> 3;
    if (in_stack_ffffffffffffffb4 == 1) {
      if ((local_3c & 0xff) != 8) goto LAB_00691139;
      _Internal::set_has_message_set_wire_format((HasBits *)&stack0xffffffffffffffd4);
      uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffff90);
      in_RDI[0x48] = uVar2 != 0;
    }
    else {
      if (in_stack_ffffffffffffffb4 == 2) {
        if ((local_3c & 0xff) == 0x10) {
          _Internal::set_has_no_standard_descriptor_accessor((HasBits *)&stack0xffffffffffffffd4);
          uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffff90);
          in_RDI[0x49] = uVar2 != 0;
          goto joined_r0x0069101b;
        }
      }
      else if (in_stack_ffffffffffffffb4 == 3) {
        if ((local_3c & 0xff) == 0x18) {
          _Internal::set_has_deprecated((HasBits *)&stack0xffffffffffffffd4);
          uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffff90);
          in_RDI[0x4a] = uVar2 != 0;
          goto joined_r0x0069101b;
        }
      }
      else if (in_stack_ffffffffffffffb4 == 7) {
        if ((local_3c & 0xff) == 0x38) {
          _Internal::set_has_map_entry((HasBits *)&stack0xffffffffffffffd4);
          uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffff90);
          in_RDI[0x4b] = uVar2 != 0;
          goto joined_r0x0069101b;
        }
      }
      else if ((in_stack_ffffffffffffffb4 == 999) && ((local_3c & 0xff) == 0x3a)) {
        do {
          in_stack_ffffffffffffffa8 = in_RDX;
          in_RDX = in_stack_ffffffffffffffa8;
          _internal_add_uninterpreted_option((MessageOptions *)0x6910dc);
          in_RSI = (UninterpretedOption *)
                   internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                             (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              (char *)in_stack_ffffffffffffff98);
          if (in_RSI == (UninterpretedOption *)0x0) goto LAB_0069122a;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,(char *)in_RSI);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<7994u>((char *)in_RSI), bVar1));
        goto LAB_00690e71;
      }
LAB_00691139:
      if (((local_3c & 7) == 4) || (local_3c == 0)) {
        internal::EpsCopyInputStream::SetLastTag(&in_RDX->super_EpsCopyInputStream,local_3c);
        goto LAB_0069120d;
      }
      if (local_3c < 8000) {
        in_RSI = (UninterpretedOption *)
                 internal::UnknownFieldParse
                           (in_stack_ffffffffffffffb4,
                            (InternalMetadataWithArena *)in_stack_ffffffffffffffa8,
                            (char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        in_stack_ffffffffffffff90 = (ParseContext *)(in_RDI + 8);
        in_stack_ffffffffffffff98 = (ParseContext *)(ulong)local_3c;
        pUVar3 = in_RSI;
        internal_default_instance();
        pUVar3 = (UninterpretedOption *)
                 internal::ExtensionSet::ParseField
                           (this_00,(uint64)__s,ptr_00,&pUVar3->super_Message,
                            (InternalMetadataWithArena *)in_RDX,in_stack_ffffffffffffffd0);
        in_stack_ffffffffffffffa0 = in_RSI;
        in_RSI = pUVar3;
      }
    }
joined_r0x0069101b:
    if (in_RSI == (UninterpretedOption *)0x0) {
LAB_0069122a:
      in_RSI = (UninterpretedOption *)0x0;
LAB_0069120d:
      internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)(in_RDI + 0x28),(HasBits<1UL> *)&stack0xffffffffffffffd4);
      return (char *)in_RSI;
    }
  } while( true );
}

Assistant:

const char* MessageOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool message_set_wire_format = 1 [default = false];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_message_set_wire_format(&has_bits);
          message_set_wire_format_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool no_standard_descriptor_accessor = 2 [default = false];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_no_standard_descriptor_accessor(&has_bits);
          no_standard_descriptor_accessor_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool map_entry = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          _Internal::set_has_map_entry(&has_bits);
          map_entry_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}